

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_>::
copyAppend(QPodArrayOps<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_>
           *this,pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_> *b,
          pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_> *e)

{
  pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_> *__dest;
  void *in_RDX;
  void *in_RSI;
  QArrayDataPointer<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_> *in_RDI;
  
  if (in_RSI != in_RDX) {
    __dest = QArrayDataPointer<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_>
             ::end(in_RDI);
    memcpy(__dest,in_RSI,((long)in_RDX - (long)in_RSI >> 4) << 4);
    in_RDI->size = ((long)in_RDX - (long)in_RSI >> 4) + in_RDI->size;
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e) noexcept
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        ::memcpy(static_cast<void *>(this->end()), static_cast<const void *>(b), (e - b) * sizeof(T));
        this->size += (e - b);
    }